

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

void fill_room(level *lev,mkroom *croom,boolean prefilled)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int y;
  int x;
  
  if (croom != (mkroom *)0x0) {
    bVar3 = croom->rtype;
    if ((char)bVar3 != 0) {
      if (prefilled == '\0') {
        if ((char)bVar3 < '\x12') {
          if (bVar3 < 0x11) {
            if ((0x141e4U >> (bVar3 & 0x1f) & 1) == 0) {
              if ((bVar3 == 4) && (croom->lx <= croom->hx)) {
                x = (int)croom->lx;
                do {
                  y = (int)croom->ly;
                  if (croom->ly <= croom->hy) {
                    do {
                      bVar4 = depth(&lev->z);
                      uVar5 = mt_random();
                      mkgold((ulong)(uVar5 % ((uint)(byte)((bVar4 ^ (char)bVar4 >> 7) -
                                                          ((char)bVar4 >> 7)) * 100) + 0x33),lev,x,y
                            );
                      bVar2 = y < croom->hy;
                      y = y + 1;
                    } while (bVar2);
                  }
                  bVar2 = x < croom->hx;
                  x = x + 1;
                } while (bVar2);
              }
            }
            else {
              fill_zoo(lev,croom);
            }
          }
        }
        else {
          stock_room((char)bVar3 + -0x12,lev,croom);
          puVar1 = &(lev->flags).field_0x8;
          *puVar1 = *puVar1 | 1;
        }
        if ('\x11' < (char)bVar3) {
          return;
        }
      }
      bVar3 = croom->rtype - 2;
      if ((bVar3 < 0xf) && ((0x517fU >> (bVar3 & 0x1f) & 1) != 0)) {
        puVar1 = &(lev->flags).field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | *(uint *)(&DAT_002d0f38 + (ulong)bVar3 * 4);
      }
    }
  }
  return;
}

Assistant:

void fill_room(struct level *lev, struct mkroom *croom, boolean prefilled)
{
	if (!croom || croom->rtype == OROOM)
	    return;

	if (!prefilled) {
	    int x, y;

	    /* Shop ? */
	    if (croom->rtype >= SHOPBASE) {
		stock_room(croom->rtype - SHOPBASE, lev, croom);
		lev->flags.has_shop = TRUE;
		return;
	    }

	    switch (croom->rtype) {
		case VAULT:
		    for (x = croom->lx; x <= croom->hx; x++)
			for (y = croom->ly; y<=croom->hy; y++)
			    mkgold((long)rn1(abs(depth(&lev->z)) * 100, 51),
				   lev, x, y);
		    break;
		case GARDEN:
		case COURT:
		case ZOO:
		case BEEHIVE:
		case LEMUREPIT:
		case MORGUE:
		case BARRACKS:
		    fill_zoo(lev, croom);
		    break;
	    }
	}
	switch (croom->rtype) {
	    case VAULT:
		lev->flags.has_vault = TRUE;
		break;
	    case ZOO:
		lev->flags.has_zoo = TRUE;
		break;
	    case GARDEN:
		lev->flags.has_garden = TRUE;
		break;
	    case COURT:
		lev->flags.has_court = TRUE;
		break;
	    case MORGUE:
		lev->flags.has_morgue = TRUE;
		break;
	    case BEEHIVE:
		lev->flags.has_beehive = TRUE;
		break;
	    case LEMUREPIT:
		lev->flags.has_lemurepit = TRUE;
		break;
	    case BARRACKS:
		lev->flags.has_barracks = TRUE;
		break;
	    case TEMPLE:
		lev->flags.has_temple = TRUE;
		break;
	    case SWAMP:
		lev->flags.has_swamp = TRUE;
		break;
	}
}